

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

SiPair * __thiscall
kj::Vector<kj::_::(anonymous_namespace)::SiPair>::add<kj::_::(anonymous_namespace)::SiPair>
          (Vector<kj::_::(anonymous_namespace)::SiPair> *this,SiPair *params)

{
  undefined8 *puVar1;
  SiPair *pSVar2;
  size_t sVar3;
  ulong uVar4;
  void *__dest;
  undefined8 *puVar5;
  ulong capacity;
  size_t __n;
  void *pvVar6;
  void *local_58;
  long lStack_50;
  void *local_48;
  undefined8 *local_40;
  
  puVar5 = *(undefined8 **)(this + 8);
  if (puVar5 == *(undefined8 **)(this + 0x10)) {
    puVar1 = *(undefined8 **)this;
    uVar4 = ((long)puVar5 - (long)puVar1) / 0x18;
    capacity = 4;
    if (puVar5 != puVar1) {
      capacity = uVar4 * 2;
    }
    if (capacity < uVar4) {
      *(undefined8 **)(this + 8) = puVar1 + capacity * 3;
    }
    __dest = _::HeapArrayDisposer::allocateImpl
                       (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pvVar6 = (void *)(capacity * 0x18 + (long)__dest);
    local_40 = &_::HeapArrayDisposer::instance;
    __n = *(long *)(this + 8) - (long)*(void **)this;
    local_58 = __dest;
    local_48 = pvVar6;
    if (__n != 0) {
      memcpy(__dest,*(void **)this,__n);
    }
    lStack_50 = (long)__dest + __n;
    ArrayBuilder<kj::_::(anonymous_namespace)::SiPair>::dispose
              ((ArrayBuilder<kj::_::(anonymous_namespace)::SiPair> *)this);
    *(void **)this = __dest;
    *(size_t *)(this + 8) = (long)__dest + __n;
    *(void **)(this + 0x10) = pvVar6;
    *(undefined8 **)(this + 0x18) = &_::HeapArrayDisposer::instance;
    local_58 = (void *)0x0;
    lStack_50 = 0;
    local_48 = (void *)0x0;
    ArrayBuilder<kj::_::(anonymous_namespace)::SiPair>::dispose
              ((ArrayBuilder<kj::_::(anonymous_namespace)::SiPair> *)&local_58);
    puVar5 = *(undefined8 **)(this + 8);
  }
  puVar5[2] = *(undefined8 *)&params->i;
  sVar3 = (params->str).content.size_;
  *puVar5 = (params->str).content.ptr;
  puVar5[1] = sVar3;
  pSVar2 = *(SiPair **)(this + 8);
  *(SiPair **)(this + 8) = pSVar2 + 1;
  return pSVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }